

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O3

void __thiscall ArgParser::test_exceptions(ArgParser *this)

{
  function<void_()> *in_RDX;
  function<void_()> *extraout_RDX;
  function<void_()> *extraout_RDX_00;
  function<void_()> *extraout_RDX_01;
  function<void_()> *extraout_RDX_02;
  function<void_()> *extraout_RDX_03;
  function<void_()> *extraout_RDX_04;
  function<void_()> *extraout_RDX_05;
  function<void_()> *extraout_RDX_06;
  function<void_()> *extraout_RDX_07;
  function<void_()> *extraout_RDX_08;
  function<void_()> *extraout_RDX_09;
  function<void_()> *extraout_RDX_10;
  function<void_()> *extraout_RDX_11;
  function<void_()> *extraout_RDX_12;
  function<void_()> *extraout_RDX_13;
  function<void_()> *extraout_RDX_14;
  function<void_()> *extraout_RDX_15;
  function<void_()> *extraout_RDX_16;
  function<void_()> *extraout_RDX_17;
  function<void_()> *extraout_RDX_18;
  function<void_()> *pfVar1;
  ArgParser *local_168;
  undefined8 local_160;
  code *local_158;
  code *local_150;
  ArgParser *local_148;
  undefined8 local_140;
  code *local_138;
  code *local_130;
  ArgParser *local_128;
  undefined8 local_120;
  code *local_118;
  code *local_110;
  ArgParser *local_108;
  undefined8 local_100;
  code *local_f8;
  code *local_f0;
  ArgParser *local_e8;
  undefined8 local_e0;
  code *local_d8;
  code *local_d0;
  ArgParser *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  ArgParser *local_a8;
  undefined8 local_a0;
  code *local_98;
  code *local_90;
  ArgParser *local_88;
  undefined8 local_80;
  code *local_78;
  code *local_70;
  ArgParser *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  ArgParser *local_48;
  undefined8 local_40;
  code *local_38;
  code *local_30;
  ArgParser *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  local_20 = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:167:30)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:167:30)>
             ::_M_manager;
  local_28 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate handler",(char *)&local_28,in_RDX);
  pfVar1 = extraout_RDX;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
    pfVar1 = extraout_RDX_00;
  }
  local_40 = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:171:30)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:171:30)>
             ::_M_manager;
  local_48 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate handler",(char *)&local_48,pfVar1);
  pfVar1 = extraout_RDX_01;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
    pfVar1 = extraout_RDX_02;
  }
  local_60 = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:175:28)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:175:28)>
             ::_M_manager;
  local_68 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate table",(char *)&local_68,pfVar1);
  pfVar1 = extraout_RDX_03;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
    pfVar1 = extraout_RDX_04;
  }
  local_80 = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:176:26)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:176:26)>
             ::_M_manager;
  local_88 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"unknown table",(char *)&local_88,pfVar1);
  pfVar1 = extraout_RDX_05;
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
    pfVar1 = extraout_RDX_06;
  }
  local_a0 = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:177:36)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:177:36)>
             ::_M_manager;
  local_a8 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add existing help topic",(char *)&local_a8,pfVar1);
  pfVar1 = extraout_RDX_07;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
    pfVar1 = extraout_RDX_08;
  }
  local_c0 = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:178:36)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:178:36)>
             ::_M_manager;
  local_c8 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add reserved help topic",(char *)&local_c8,pfVar1);
  pfVar1 = extraout_RDX_09;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
    pfVar1 = extraout_RDX_10;
  }
  local_e0 = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:179:33)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:179:33)>
             ::_M_manager;
  local_e8 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add to unknown topic",(char *)&local_e8,pfVar1);
  pfVar1 = extraout_RDX_11;
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
    pfVar1 = extraout_RDX_12;
  }
  local_100 = 0;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:180:32)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:180:32)>
             ::_M_manager;
  local_108 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"bad option for help",(char *)&local_108,pfVar1);
  pfVar1 = extraout_RDX_13;
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
    pfVar1 = extraout_RDX_14;
  }
  local_120 = 0;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:181:31)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:181:31)>
              ::_M_manager;
  local_128 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"bad topic for help",(char *)&local_128,pfVar1);
  pfVar1 = extraout_RDX_15;
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,3);
    pfVar1 = extraout_RDX_16;
  }
  local_140 = 0;
  local_130 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:183:9)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:183:9)>
              ::_M_manager;
  local_148 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate option help",(char *)&local_148,pfVar1);
  pfVar1 = extraout_RDX_17;
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
    pfVar1 = extraout_RDX_18;
  }
  local_160 = 0;
  local_150 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:185:9)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:185:9)>
              ::_M_manager;
  local_168 = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"invalid choice handler to unknown",(char *)&local_168,
             pfVar1);
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  return;
}

Assistant:

void
ArgParser::test_exceptions()
{
    auto err = [](char const* msg, std::function<void()> fn) {
        try {
            fn();
            assert(msg == nullptr);
        } catch (std::exception& e) {
            std::cout << msg << ": " << e.what() << std::endl;
        }
    };

    err("duplicate handler", [this]() {
        ap.selectMainOptionTable();
        ap.addBare("potato", []() {});
    });
    err("duplicate handler", [this]() {
        ap.selectOptionTable("baaa");
        ap.addBare("ram", []() {});
    });
    err("duplicate table", [this]() { ap.registerOptionTable("baaa", nullptr); });
    err("unknown table", [this]() { ap.selectOptionTable("aardvark"); });
    err("add existing help topic", [this]() { ap.addHelpTopic("baaa", "potato", "salad"); });
    err("add reserved help topic", [this]() { ap.addHelpTopic("all", "potato", "salad"); });
    err("add to unknown topic", [this]() { ap.addOptionHelp("--new", "oops", "potato", "salad"); });
    err("bad option for help", [this]() { ap.addOptionHelp("nodash", "baaa", "potato", "salad"); });
    err("bad topic for help", [this]() { ap.addHelpTopic("--dashes", "potato", "salad"); });
    err("duplicate option help",
        [this]() { ap.addOptionHelp("--ewe", "baaa", "potato", "salad"); });
    err("invalid choice handler to unknown",
        [this]() { ap.addInvalidChoiceHandler("elephant", [](std::string const&) {}); });
}